

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

FloatImageTexture * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::FloatImageTexture,pbrt::FloatImageTexture&>
          (polymorphic_allocator<std::byte> *this,FloatImageTexture *args)

{
  MIPMap *pMVar1;
  bool bVar2;
  undefined3 uVar3;
  int iVar4;
  undefined4 extraout_var;
  FloatImageTexture *pFVar5;
  
  iVar4 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x18,8);
  pFVar5 = (FloatImageTexture *)CONCAT44(extraout_var,iVar4);
  (pFVar5->super_ImageTextureBase).mapping.
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = 0;
  (pFVar5->super_ImageTextureBase).mapping.
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (args->super_ImageTextureBase).mapping.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  bVar2 = (args->super_ImageTextureBase).invert;
  uVar3 = *(undefined3 *)&(args->super_ImageTextureBase).field_0xd;
  pMVar1 = (args->super_ImageTextureBase).mipmap;
  (pFVar5->super_ImageTextureBase).scale = (args->super_ImageTextureBase).scale;
  (pFVar5->super_ImageTextureBase).invert = bVar2;
  *(undefined3 *)&(pFVar5->super_ImageTextureBase).field_0xd = uVar3;
  (pFVar5->super_ImageTextureBase).mipmap = pMVar1;
  return pFVar5;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }